

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS_linux_common.cpp
# Opt level: O3

bool __thiscall
OS::Services_Common::GetControl(Services_Common *this,string *name,void *pValue,size_t size)

{
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  char *pStr;
  string *psVar7;
  string fileName;
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,ENV_PREFIX,&local_51);
  std::__cxx11::string::_M_append((char *)&local_50,(ulong)(name->_M_dataplus)._M_p);
  pcVar5 = getenv(local_50._M_dataplus._M_p);
  if (size == 4 && pcVar5 != (char *)0x0) {
    iVar4 = atoi(pcVar5);
    *(int *)pValue = iVar4;
LAB_00106b41:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((pcVar5 != (char *)0x0) && (sVar6 = strlen(pcVar5), sVar6 < size)) {
      strcpy((char *)pValue,pcVar5);
      goto LAB_00106b41;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (!bVar2) {
    return true;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  pcVar5 = getenv("HOME");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,(char *)0x0,(ulong)pcVar5);
    std::__cxx11::string::append((char *)&local_50);
    psVar7 = &local_50;
    std::__cxx11::string::append((char *)psVar7);
    bVar2 = GetControlFromFile((Services_Common *)psVar7,&local_50,name,pValue,size);
    bVar3 = true;
    pcVar5 = (char *)local_50._M_string_length;
    if (bVar2) goto LAB_00106c5d;
  }
  puVar1 = SYSTEM_DIR;
  strlen(SYSTEM_DIR);
  std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar5,(ulong)puVar1);
  std::__cxx11::string::append((char *)&local_50);
  psVar7 = &local_50;
  std::__cxx11::string::append((char *)psVar7);
  bVar3 = GetControlFromFile((Services_Common *)psVar7,&local_50,name,pValue,size);
LAB_00106c5d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool Services_Common::GetControl(
    const std::string& name,
    void* pValue,
    size_t size ) const
{
    // Look at environment variables first:
    {
        std::string envName(ENV_PREFIX);
        envName += name;
        const char *envVal = getenv(envName.c_str());
        if( ( envVal != NULL ) && ( size == sizeof(unsigned int) ) )
        {
            unsigned int *puVal = (unsigned int *)pValue;
            *puVal = atoi(envVal);
            return true;
        }
        else if( ( envVal != NULL ) && ( strlen(envVal) < size ) )
        {
            char* pStr = (char*)pValue;
            strcpy( pStr, envVal );
            return true;
        }
    }

    // Look at config files second:
    bool    found = false;
    std::string fileName;

    // First, check for a config file in the HOME directory.
    const char *envVal = getenv("HOME");
    if( !found && envVal != NULL )
    {
        fileName = envVal;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

#ifdef __ANDROID__
    // On Android, check the sdcard directory next.
    if( !found )
    {
        fileName = "/sdcard/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }
#endif

    // Finally, check the "system" directory.
    if( !found )
    {
        fileName = SYSTEM_DIR;
        fileName += "/";
        fileName += CONFIG_FILE;
        found = GetControlFromFile(
            fileName,
            name,
            pValue,
            size );
    }

    return found;
}